

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_diag_gen(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *ab;
  REF_DBL *a_00;
  REF_DBL *a_01;
  REF_DBL *q;
  REF_DBL *r;
  ulong uVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  long lVar9;
  int cols;
  ulong uVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  cols = n + 1;
  if (cols * n < 0) {
    RVar3 = 1;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x418,
           "ref_matrix_diag_gen","malloc ab of REF_DBL negative");
  }
  else {
    ab = (REF_DBL *)malloc((ulong)(uint)(cols * n) << 3);
    if (ab == (REF_DBL *)0x0) {
      pcVar13 = "malloc ab of REF_DBL NULL";
      uVar8 = 0x418;
    }
    else {
      uVar15 = (ulong)(uint)(n * n);
      __size = uVar15 * 8;
      a_00 = (REF_DBL *)malloc(__size);
      if (a_00 == (REF_DBL *)0x0) {
        pcVar13 = "malloc qq of REF_DBL NULL";
        uVar8 = 0x419;
      }
      else {
        a_01 = (REF_DBL *)malloc(__size);
        if (a_01 == (REF_DBL *)0x0) {
          pcVar13 = "malloc rq of REF_DBL NULL";
          uVar8 = 0x41a;
        }
        else {
          q = (REF_DBL *)malloc(__size);
          if (q == (REF_DBL *)0x0) {
            pcVar13 = "malloc q of REF_DBL NULL";
            uVar8 = 0x41b;
          }
          else {
            r = (REF_DBL *)malloc(__size);
            if (r != (REF_DBL *)0x0) {
              lVar9 = (long)n;
              uVar4 = 0;
              uVar17 = 0;
              if (0 < n) {
                uVar17 = (ulong)(uint)n;
              }
              uVar16 = (ulong)(uint)n;
              pRVar5 = a_01;
              pRVar6 = a;
              for (; uVar4 != uVar17; uVar4 = uVar4 + 1) {
                for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                  pRVar5[uVar10] = pRVar6[uVar10];
                }
                pRVar6 = pRVar6 + lVar9;
                pRVar5 = pRVar5 + lVar9;
              }
              pRVar5 = vectors;
              for (uVar4 = 0; uVar4 != uVar17; uVar4 = uVar4 + 1) {
                for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                  pRVar5[uVar10] = 0.0;
                }
                pRVar5 = pRVar5 + lVar9;
              }
              iVar1 = 0;
              uVar4 = uVar17;
              while (bVar18 = uVar4 != 0, uVar4 = uVar4 - 1, bVar18) {
                vectors[iVar1] = 1.0;
                iVar1 = iVar1 + cols;
              }
              dVar21 = 1.0;
              iVar1 = 0;
              do {
                if (dVar21 <= 1e-13) goto LAB_00182a81;
                uVar2 = ref_matrix_qr(n,n,a_01,q,r);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                         ,0x42a,"ref_matrix_diag_gen",(ulong)uVar2,"qr");
                  return uVar2;
                }
                iVar1 = iVar1 + 1;
                ref_matrix_mult_gen(n,r,q,a_01);
                pRVar5 = a_00;
                pRVar6 = vectors;
                for (uVar4 = 0; uVar4 != uVar17; uVar4 = uVar4 + 1) {
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    pRVar5[uVar10] = pRVar6[uVar10];
                  }
                  pRVar6 = pRVar6 + lVar9;
                  pRVar5 = pRVar5 + lVar9;
                }
                ref_matrix_mult_gen(n,a_00,q,vectors);
                dVar21 = 0.0;
                iVar12 = 1;
                pRVar5 = a_01;
                for (uVar4 = 0; uVar4 != uVar17; uVar4 = uVar4 + 1) {
                  for (lVar11 = (long)iVar12; lVar11 < lVar9; lVar11 = lVar11 + 1) {
                    dVar19 = pRVar5[lVar11];
                    if (dVar19 <= -dVar19) {
                      dVar19 = -dVar19;
                    }
                    if (dVar21 <= dVar19) {
                      dVar21 = dVar19;
                    }
                  }
                  iVar12 = iVar12 + 1;
                  pRVar5 = pRVar5 + lVar9;
                }
                dVar19 = 0.0;
                iVar12 = 0;
                uVar4 = uVar17;
                while (bVar18 = uVar4 != 0, uVar4 = uVar4 - 1, bVar18) {
                  dVar20 = a_01[iVar12];
                  if (dVar20 <= -dVar20) {
                    dVar20 = -dVar20;
                  }
                  dVar19 = dVar19 + dVar20;
                  iVar12 = iVar12 + cols;
                }
                dVar21 = dVar21 / dVar19;
              } while (iVar1 != 0x7a121);
              iVar1 = 0;
              for (uVar4 = 0; uVar17 != uVar4; uVar4 = uVar4 + 1) {
                values[uVar4] = a_01[iVar1];
                iVar1 = iVar1 + cols;
              }
              ref_matrix_show_eig(n,a,values,vectors);
              printf("conv before shift %e used %d\n",dVar21);
LAB_00182a81:
              iVar1 = 0;
              for (uVar4 = 0; uVar17 != uVar4; uVar4 = uVar4 + 1) {
                values[uVar4] = a_01[iVar1];
                iVar1 = iVar1 + cols;
              }
              uVar4 = 0;
              pRVar5 = vectors;
              do {
                if (uVar4 == uVar17) {
                  free(r);
                  free(q);
                  free(a_01);
                  free(a_00);
                  free(ab);
                  return 0;
                }
                iVar1 = 0;
                dVar21 = 1.0;
                do {
                  if (dVar21 <= 1e-13) goto LAB_00182cb6;
                  pRVar6 = ab;
                  pRVar7 = a;
                  for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
                    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
                      pRVar6[uVar14] = pRVar7[uVar14];
                    }
                    pRVar7 = pRVar7 + lVar9;
                    pRVar6 = pRVar6 + lVar9;
                  }
                  iVar12 = 0;
                  uVar10 = uVar16;
                  while (bVar18 = uVar10 != 0, uVar10 = uVar10 - 1, bVar18) {
                    ab[iVar12] = values[uVar4] * -1.0001 + ab[iVar12];
                    iVar12 = iVar12 + cols;
                  }
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    ab[uVar15 + uVar10] = pRVar5[uVar10];
                  }
                  iVar1 = iVar1 + 1;
                  RVar3 = ref_matrix_solve_ab(n,cols,ab);
                  if (RVar3 != 0) {
                    ref_matrix_show_ab(n,cols,ab);
                    ref_matrix_show_eig(n,a,values,vectors);
                    printf("vectr %d conv %e used %d\n",dVar21,uVar4,iVar1);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c"
                           ,0x452,"ref_matrix_diag_gen","solve");
                    return 1;
                  }
                  dVar21 = 0.0;
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    dVar21 = dVar21 + ab[uVar15 + uVar10] * ab[uVar15 + uVar10];
                  }
                  if (dVar21 < 0.0) {
                    dVar21 = sqrt(dVar21);
                  }
                  else {
                    dVar21 = SQRT(dVar21);
                  }
                  dVar19 = dVar21 * 1e+20;
                  if (dVar19 <= -dVar19) {
                    dVar19 = -dVar19;
                  }
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    dVar20 = ab[uVar15 + uVar10];
                    dVar22 = dVar20;
                    if (dVar20 <= -dVar20) {
                      dVar22 = -dVar20;
                    }
                    if (dVar19 <= dVar22) {
                      return 4;
                    }
                    ab[uVar15 + uVar10] = dVar20 / dVar21;
                  }
                  dVar21 = 0.0;
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    dVar21 = dVar21 + (pRVar5[uVar10] - ab[uVar15 + uVar10]) *
                                      (pRVar5[uVar10] - ab[uVar15 + uVar10]);
                  }
                  dVar19 = 0.0;
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    dVar19 = dVar19 + (pRVar5[uVar10] + ab[uVar15 + uVar10]) *
                                      (pRVar5[uVar10] + ab[uVar15 + uVar10]);
                  }
                  for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
                    pRVar5[uVar10] = ab[uVar15 + uVar10];
                  }
                  if (dVar19 <= dVar21) {
                    dVar21 = dVar19;
                  }
                } while (iVar1 != 0x186a1);
                printf("vectr %d conv %e used %d\n",uVar4,0x186a1);
LAB_00182cb6:
                uVar4 = uVar4 + 1;
                pRVar5 = pRVar5 + lVar9;
              } while( true );
            }
            pcVar13 = "malloc r of REF_DBL NULL";
            uVar8 = 0x41c;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",uVar8,
           "ref_matrix_diag_gen",pcVar13);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_gen(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_DBL *q, *r, *rq, *qq, *ab;
  REF_INT i, j, k, iter;
  REF_DBL max_lower, trace, conv, convm;
  REF_DBL len;

  ref_malloc(ab, n * (n + 1), REF_DBL);
  ref_malloc(qq, n * n, REF_DBL);
  ref_malloc(rq, n * n, REF_DBL);
  ref_malloc(q, n * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) rq[i + j * n] = a[i + j * n];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) vectors[i + j * n] = 0.0;
  for (i = 0; i < n; i++) vectors[i + i * n] = 1.0;

  iter = 0;
  conv = 1.0;
  while (conv > 1.0e-13) {
    iter++;

    RSS(ref_matrix_qr(n, n, rq, q, r), "qr");
    ref_matrix_mult_gen(n, r, q, rq);

    for (j = 0; j < n; j++)
      for (i = 0; i < n; i++) qq[i + j * n] = vectors[i + j * n];
    ref_matrix_mult_gen(n, qq, q, vectors);

    max_lower = 0.0;
    for (j = 0; j < n; j++)
      for (i = j + 1; i < n; i++)
        max_lower = MAX(max_lower, ABS(rq[i + j * n]));
    trace = 0.0;
    for (i = 0; i < n; i++) trace += ABS(rq[i + i * n]);
    conv = max_lower / trace;

    if (iter > 500000) {
      for (i = 0; i < n; i++) values[i] = rq[i + i * n];
      RSS(ref_matrix_show_eig(n, a, values, vectors), "show");
      printf("conv before shift %e used %d\n", conv, iter);
      break;
    }
  }

  for (i = 0; i < n; i++) values[i] = rq[i + i * n];

  for (k = 0; k < n; k++) {
    iter = 0;
    conv = 1.0;
    while (conv > 1.0e-13) {
      iter++;
      for (j = 0; j < n; j++)
        for (i = 0; i < n; i++) ab[i + j * n] = a[i + j * n];
      for (i = 0; i < n; i++) ab[i + i * n] -= 1.0001 * values[k];

      for (i = 0; i < n; i++) ab[i + n * n] = vectors[i + k * n];

      if (REF_SUCCESS != ref_matrix_solve_ab(n, n + 1, ab)) {
        ref_matrix_show_ab(n, n + 1, ab);
        ref_matrix_show_eig(n, a, values, vectors);
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        THROW("solve");
      }

      len = 0.0;
      for (i = 0; i < n; i++) len += ab[i + n * n] * ab[i + n * n];
      len = sqrt(len);
      for (i = 0; i < n; i++) {
        if (!ref_math_divisible(ab[i + n * n], len)) return REF_DIV_ZERO;
        ab[i + n * n] = ab[i + n * n] / len;
      }

      conv = 0.0;
      for (i = 0; i < n; i++)
        conv += (vectors[i + k * n] - ab[i + n * n]) *
                (vectors[i + k * n] - ab[i + n * n]);
      convm = 0.0;
      for (i = 0; i < n; i++)
        convm += (vectors[i + k * n] + ab[i + n * n]) *
                 (vectors[i + k * n] + ab[i + n * n]);

      conv = MIN(conv, convm);

      for (i = 0; i < n; i++) vectors[i + k * n] = ab[i + n * n];

      if (iter > 100000) {
        printf("vectr %d conv %e used %d\n", k, conv, iter);
        break;
      }
    }
  }

  ref_free(r);
  ref_free(q);
  ref_free(rq);
  ref_free(qq);
  ref_free(ab);

  return REF_SUCCESS;
}